

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  undefined1 uVar1;
  long lVar2;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  appender aVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  char cVar14;
  float_specs fVar15;
  undefined8 uVar16;
  int iVar17;
  uint uVar18;
  float_specs fVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  float_specs fVar23;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  char *significand;
  int exp;
  anon_class_40_8_dbbf3351 write;
  digit_grouping<char> grouping;
  undefined1 local_103 [3];
  undefined1 local_100 [4];
  int local_fc;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_f8;
  float_specs local_f0;
  float_specs local_e8;
  int local_dc;
  big_decimal_fp *local_d8;
  undefined1 local_d0 [20];
  undefined1 auStack_bc [20];
  float_specs *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  char *local_90;
  ulong local_88;
  float_specs local_80;
  float_specs local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_e8 = (float_specs)f->significand;
  iVar6 = f->significand_size;
  local_103[2] = '0';
  local_103[1] = fspecs._5_1_;
  local_fc = iVar6;
  local_78 = fspecs;
  if (iVar6 < 0) goto LAB_00210806;
  fVar15.precision = (iVar6 + 1) - (uint)(local_103[1] == '\0');
  fVar15._4_4_ = 0;
  local_103[0] = '.';
  uVar12 = fspecs._4_4_;
  uVar13 = (ulong)fspecs >> 0x28;
  fVar19 = fspecs;
  fVar23 = local_e8;
  if ((uVar12 >> 0x11 & 1) != 0) {
    local_f8 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    local_f0 = fspecs;
    local_88 = (ulong)fspecs >> 0x28;
    local_80 = local_e8;
    local_103[0] = decimal_point_impl<char>(loc);
    uVar13 = local_88;
    out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
         (back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_f8.container;
    fVar19 = local_f0;
    fVar23 = local_80;
  }
  uVar16 = auStack_bc._4_8_;
  uVar18 = f->exponent;
  iVar10 = iVar6 + uVar18;
  iVar17 = fVar19.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_00210467:
    iVar22 = iVar6 + uVar18 + -1;
    if ((uVar12 >> 0x13 & 1) == 0) {
      uVar21 = 0;
      if (iVar6 == 1) {
        local_103[0] = '\0';
        uVar21 = 0;
      }
    }
    else {
      uVar21 = 0;
      if (0 < iVar17 - iVar6) {
        uVar21 = (ulong)(uint)(iVar17 - iVar6);
      }
      fVar15 = (float_specs)((long)fVar15 + uVar21);
    }
    local_d0[0] = (sign_t)uVar13;
    auStack_bc[0] = local_103[0];
    local_d0._16_4_ = iVar6;
    auStack_bc._4_5_ = CONCAT14('0',(int)uVar21);
    auStack_bc._10_2_ = SUB82(uVar16,6);
    auStack_bc._4_8_ =
         CONCAT26(auStack_bc._10_2_,CONCAT15(((uVar12 >> 0x10 & 1) == 0) << 5,auStack_bc._4_5_)) |
         0x450000000000;
    auStack_bc._12_4_ = iVar22;
    local_d0._8_8_ = fVar23;
    if (specs->width < 1) {
      uVar1 = local_103[0];
      iVar10 = (int)uVar21;
      if ((sign_t)uVar13 != none) {
        cVar14 = ""[uVar13 & 0xff];
        sVar8 = ((buffer<char> *)
                out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)->size_;
        uVar13 = sVar8 + 1;
        if (((buffer<char> *)
            out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)->capacity_ <
            uVar13) {
          (**((buffer<char> *)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)->
             _vptr_buffer)(out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                          );
          sVar8 = ((buffer<char> *)
                  out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)->size_;
          uVar13 = sVar8 + 1;
        }
        ((buffer<char> *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
        ->size_ = uVar13;
        ((buffer<char> *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
        ->ptr_[sVar8] = cVar14;
        uVar1 = auStack_bc[0];
        iVar6 = local_d0._16_4_;
        iVar10 = auStack_bc._4_4_;
      }
      bVar3.container =
           (buffer<char> *)
           write_significand<fmt::v10::appender,char>(out,(char *)local_d0._8_8_,iVar6,1,uVar1);
      if (0 < iVar10) {
        bVar3.container =
             (buffer<char> *)
             fill_n<fmt::v10::appender,int,char>((appender)bVar3.container,iVar10,auStack_bc + 8);
      }
      uVar1 = auStack_bc[9];
      sVar8 = (bVar3.container)->size_;
      uVar13 = sVar8 + 1;
      if ((bVar3.container)->capacity_ < uVar13) {
        (**(bVar3.container)->_vptr_buffer)(bVar3.container);
        sVar8 = (bVar3.container)->size_;
        uVar13 = sVar8 + 1;
      }
      (bVar3.container)->size_ = uVar13;
      (bVar3.container)->ptr_[sVar8] = uVar1;
      bVar3.container =
           (buffer<char> *)
           write_exponent<char,fmt::v10::appender>(auStack_bc._12_4_,bVar3.container);
    }
    else {
      if (iVar10 < 1) {
        iVar22 = 1 - iVar10;
      }
      lVar20 = 2;
      if (99 < iVar22) {
        lVar20 = (ulong)(999 < iVar22) + 3;
      }
      sVar8 = (long)fVar15 + (3 - (ulong)(local_103[0] == '\0')) + lVar20;
      bVar3.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                     (out,specs,sVar8,sVar8,(anon_class_40_8_dbbf3351 *)local_d0);
    }
  }
  else {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      iVar22 = 0x10;
      if (0 < iVar17) {
        iVar22 = iVar17;
      }
      if ((iVar10 < -3) || (iVar22 < iVar10)) goto LAB_00210467;
    }
    local_dc = iVar10;
    if ((int)uVar18 < 0) {
      if (iVar10 < 1) {
        iVar11 = -iVar10;
        iVar22 = iVar11;
        if (SBORROW4(iVar17,iVar11) != iVar17 + iVar10 < 0) {
          iVar22 = iVar17;
        }
        if (iVar17 < 0) {
          iVar22 = iVar11;
        }
        if (iVar6 != 0) {
          iVar22 = iVar11;
        }
        local_70._M_allocated_capacity._0_4_ = iVar22;
        if (iVar6 == 0 && iVar22 == 0) {
          local_100[0] = (char)((uVar12 & 0x80000) >> 0x13);
          iVar6 = 2 - (uint)(((ulong)fspecs & 0x8000000000000) == 0);
        }
        else {
          local_100[0] = 1;
          iVar6 = 2;
          if (iVar22 < 0) {
LAB_00210806:
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/core.h"
                        ,0x189,"negative value");
          }
        }
        sVar8 = (ulong)(uint)(iVar6 + iVar22) + (long)fVar15;
        local_d0._0_8_ = local_103 + 1;
        local_d0._8_8_ = local_103 + 2;
        unique0x00004e80 = local_100;
        auStack_bc._4_8_ = local_103;
        auStack_bc._12_8_ = &local_70;
        local_a8 = &local_e8;
        local_a0._M_allocated_capacity = (size_type)&local_fc;
        aVar5 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_&>
                          (out,specs,sVar8,sVar8,(anon_class_56_7_162c6e41 *)local_d0);
        return (appender)
               aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container
        ;
      }
      iVar22 = 0;
      local_100 = (undefined1  [4])(iVar17 - iVar6 & (int)(uVar12 << 0xc) >> 0x1f);
      uVar18 = (uint)local_100;
      if ((int)local_100 < 1) {
        uVar18 = 0;
      }
      local_f8.container = (buffer<char> *)specs;
      local_f0 = fVar15;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_d0,loc,(bool)((byte)(uVar12 >> 0x11) & 1));
      if (local_a8 != (float_specs *)0x0) {
        pcVar7 = (char *)((long)(int *)local_d0._8_8_ + local_d0._0_8_);
        lVar20 = 0;
        pcVar9 = (char *)local_d0._0_8_;
        do {
          if (pcVar9 == pcVar7) {
            cVar14 = pcVar7[-1];
            pcVar9 = pcVar7;
          }
          else {
            cVar14 = *pcVar9;
            if ((byte)(cVar14 + 0x81U) < 0x82) goto LAB_0021082d;
            pcVar9 = pcVar9 + 1;
          }
          iVar22 = iVar22 + cVar14;
          if (iVar10 <= iVar22) goto LAB_0021082d;
          lVar20 = lVar20 + 1;
        } while( true );
      }
      lVar20 = 0;
LAB_0021082d:
      sVar8 = (ulong)uVar18 + (long)local_f0 + lVar20 + 1;
      local_70._M_allocated_capacity = (size_type)(local_103 + 1);
      local_70._8_8_ = &local_e8;
      local_60._M_allocated_capacity = (size_type)&local_fc;
      local_60._8_8_ = &local_dc;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_103;
      local_40._M_allocated_capacity = (size_type)local_100;
      local_40._8_8_ = local_103 + 2;
      local_48 = (digit_grouping<char> *)local_d0;
      bVar3.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_&>
                     (out,local_f8.container,sVar8,sVar8,(anon_class_64_8_e6ffa566 *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_bc._12_8_ != &local_a0) {
        operator_delete((void *)auStack_bc._12_8_);
      }
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_d0 + 0x10);
    }
    else {
      lVar20 = (ulong)uVar18 + (long)fVar15;
      local_100 = (undefined1  [4])(iVar17 - iVar10);
      if ((uVar12 >> 0x13 & 1) != 0) {
        lVar20 = lVar20 + 1;
        if (fspecs._4_1_ == '\x02' || 0 < (int)local_100) {
          if (0 < (int)local_100) {
            lVar20 = lVar20 + (ulong)(uint)local_100;
          }
        }
        else {
          local_100 = (undefined1  [4])0x0;
        }
      }
      local_d8 = f;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar12 >> 0x11) & 1));
      iVar6 = 0;
      if (local_48 != (digit_grouping<char> *)0x0) {
        pcVar9 = (char *)(local_70._8_8_ + local_70._M_allocated_capacity);
        lVar2 = 0;
        uVar16 = local_70._M_allocated_capacity;
        do {
          if ((char *)uVar16 == pcVar9) {
            cVar14 = pcVar9[-1];
            uVar16 = pcVar9;
          }
          else {
            cVar14 = *(char *)uVar16;
            if ((byte)(cVar14 + 0x81U) < 0x82) goto LAB_0021074b;
            uVar16 = (char *)(uVar16 + 1);
          }
          iVar6 = iVar6 + cVar14;
          if (iVar10 <= iVar6) goto LAB_0021074b;
          lVar2 = lVar2 + 1;
        } while( true );
      }
      lVar2 = 0;
LAB_0021074b:
      local_d0._0_8_ = local_103 + 1;
      local_d0._8_8_ = &local_e8;
      unique0x00004e80 = &local_fc;
      auStack_bc._4_8_ = local_d8;
      local_a8 = &local_78;
      local_a0._M_allocated_capacity = (size_type)local_103;
      local_a0._8_8_ = local_100;
      local_90 = local_103 + 2;
      auStack_bc._12_8_ = &local_70;
      bVar3.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::big_decimal_fp,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::big_decimal_fp_const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_&>
                     (out,specs,lVar20 + lVar2,lVar20 + lVar2,(anon_class_72_9_0c6a3a8a *)local_d0);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      paVar4 = &local_60;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar4->_M_allocated_capacity)[-2] != paVar4) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar4->_M_allocated_capacity)[-2]);
    }
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}